

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gflags_reporting.cc
# Opt level: O0

void google::AddString(string *s,string *final_string,int *chars_in_line)

{
  int iVar1;
  int slen;
  int *chars_in_line_local;
  string *final_string_local;
  string *s_local;
  
  iVar1 = std::__cxx11::string::length();
  if (*chars_in_line + 1 + iVar1 < 0x50) {
    std::__cxx11::string::operator+=((string *)final_string," ");
    *chars_in_line = *chars_in_line + 1;
  }
  else {
    std::__cxx11::string::operator+=((string *)final_string,"\n      ");
    *chars_in_line = 6;
  }
  std::__cxx11::string::operator+=((string *)final_string,(string *)s);
  *chars_in_line = iVar1 + *chars_in_line;
  return;
}

Assistant:

static void AddString(const string& s,
                      string* final_string, int* chars_in_line) {
  const int slen = static_cast<int>(s.length());
  if (*chars_in_line + 1 + slen >= kLineLength) {  // < 80 chars/line
    *final_string += "\n      ";
    *chars_in_line = 6;
  } else {
    *final_string += " ";
    *chars_in_line += 1;
  }
  *final_string += s;
  *chars_in_line += slen;
}